

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

void annEnclRect(ANNpointArray pa,ANNidxArray pidx,int n,int dim,ANNorthRect *bnds)

{
  int i;
  ANNcoord hi_bnd;
  ANNcoord lo_bnd;
  int d;
  ANNorthRect *bnds_local;
  int dim_local;
  int n_local;
  ANNidxArray pidx_local;
  ANNpointArray pa_local;
  
  for (d = 0; d < dim; d = d + 1) {
    lo_bnd = pa[*pidx][d];
    hi_bnd = pa[*pidx][d];
    for (i = 0; i < n; i = i + 1) {
      if (lo_bnd <= pa[pidx[i]][d]) {
        if (hi_bnd < pa[pidx[i]][d]) {
          hi_bnd = pa[pidx[i]][d];
        }
      }
      else {
        lo_bnd = pa[pidx[i]][d];
      }
    }
    bnds->lo[d] = lo_bnd;
    bnds->hi[d] = hi_bnd;
  }
  return;
}

Assistant:

void annEnclRect(ANNpointArray pa,   // point array
                 ANNidxArray pidx,   // point indices
                 int n,              // number of points
                 int dim,            // dimension
                 ANNorthRect &bnds)  // bounding cube (returned)
{
    for (int d = 0; d < dim; d++) {  // find smallest enclosing rectangle
        ANNcoord lo_bnd = PA(0, d);  // lower bound on dimension d
        ANNcoord hi_bnd = PA(0, d);  // upper bound on dimension d
        for (int i = 0; i < n; i++) {
            if (PA(i, d) < lo_bnd)
                lo_bnd = PA(i, d);
            else if (PA(i, d) > hi_bnd)
                hi_bnd = PA(i, d);
        }
        bnds.lo[d] = lo_bnd;
        bnds.hi[d] = hi_bnd;
    }
}